

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O2

void oonf_subsystem_initiate_shutdown(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  plVar1 = oonf_plugin_tree.list_head.next;
  while (plVar3 = plVar1, plVar3->prev != oonf_plugin_tree.list_head.prev) {
    plVar2 = plVar3[-4].prev;
    plVar1 = plVar3->next;
    if (plVar2 != (list_entity *)0x0) {
      if ((log_global_mask[4] & 1) != 0) {
        oonf_log(LOG_SEVERITY_DEBUG,LOG_PLUGINS,"src/libcore/oonf_subsystem.c",0xdf,(void *)0x0,0,
                 "Initiate Shutdown: %s");
        plVar2 = plVar3[-4].prev;
      }
      (*(code *)plVar2)();
    }
  }
  return;
}

Assistant:

void
oonf_subsystem_initiate_shutdown(void) {
  struct oonf_subsystem *plugin, *iterator;

  avl_for_each_element_safe(&oonf_plugin_tree, plugin, _node, iterator) {
    if (plugin->initiate_shutdown) {
      OONF_DEBUG(LOG_PLUGINS, "Initiate Shutdown: %s", plugin->name);
      plugin->initiate_shutdown();
    }
  }
}